

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O2

bool CheckMinimalPush(vector<unsigned_char,_std::allocator<unsigned_char>_> *data,opcodetype opcode)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  bool bVar5;
  
  if (OP_PUSHDATA4 < opcode) {
    __assert_fail("0 <= opcode && opcode <= OP_PUSHDATA4",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/script.cpp"
                  ,0x170,"bool CheckMinimalPush(const std::vector<unsigned char> &, opcodetype)");
  }
  pbVar2 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pbVar3 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar4 = (long)pbVar3 - (long)pbVar2;
  if (uVar4 == 1) {
    bVar1 = *pbVar2;
    if ((bVar1 != 0) && (bVar1 == 0x81 || bVar1 < 0x11)) {
      bVar5 = false;
      goto LAB_001e44dd;
    }
  }
  else {
    if (pbVar3 == pbVar2) {
      bVar5 = opcode == OP_0;
      goto LAB_001e44dd;
    }
    if (0x4b < uVar4) {
      if (uVar4 < 0x100) {
        bVar5 = opcode == OP_PUSHDATA1;
      }
      else {
        bVar5 = opcode == OP_PUSHDATA2 || 0xffff < uVar4;
      }
      goto LAB_001e44dd;
    }
  }
  bVar5 = uVar4 == opcode;
LAB_001e44dd:
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool CheckMinimalPush(const std::vector<unsigned char>& data, opcodetype opcode) {
    // Excludes OP_1NEGATE, OP_1-16 since they are by definition minimal
    assert(0 <= opcode && opcode <= OP_PUSHDATA4);
    if (data.size() == 0) {
        // Should have used OP_0.
        return opcode == OP_0;
    } else if (data.size() == 1 && data[0] >= 1 && data[0] <= 16) {
        // Should have used OP_1 .. OP_16.
        return false;
    } else if (data.size() == 1 && data[0] == 0x81) {
        // Should have used OP_1NEGATE.
        return false;
    } else if (data.size() <= 75) {
        // Must have used a direct push (opcode indicating number of bytes pushed + those bytes).
        return opcode == data.size();
    } else if (data.size() <= 255) {
        // Must have used OP_PUSHDATA.
        return opcode == OP_PUSHDATA1;
    } else if (data.size() <= 65535) {
        // Must have used OP_PUSHDATA2.
        return opcode == OP_PUSHDATA2;
    }
    return true;
}